

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall Js::InterpreterStackFrame::InitializeClosures(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  FunctionBody *this_00;
  Var pvVar6;
  ScriptContext *pSVar7;
  undefined4 *puVar8;
  void *argHead;
  RegSlot frameDisplayReg;
  RegSlot closureReg;
  RegSlot funcExprScopeReg;
  Var funcExprScope;
  Var varThis;
  FrameDisplay *pFStack_20;
  RegSlot thisRegForEventHandler;
  Var environment;
  FunctionBody *executeFunction;
  InterpreterStackFrame *this_local;
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  bVar2 = FunctionBody::IsParamAndBodyScopeMerged(this_00);
  if (bVar2) {
    SetIsParamScopeDone(this,true);
  }
  RVar3 = FunctionBody::GetThisRegisterForEventHandler(this_00);
  if (RVar3 == 0xffffffff) {
    if (*(long *)(this + 0x60) == 0) {
      pFStack_20 = (FrameDisplay *)LdEnv(this);
    }
    else {
      bVar2 = FunctionBody::IsParamAndBodyScopeMerged(this_00);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x603,"(!executeFunction->IsParamAndBodyScopeMerged())",
                                    "!executeFunction->IsParamAndBodyScopeMerged()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pFStack_20 = GetLocalFrameDisplay(this);
    }
  }
  else {
    pvVar6 = OP_ArgIn0(this);
    SetReg<unsigned_int>(this,RVar3,pvVar6);
    pSVar7 = GetScriptContext(this);
    pFStack_20 = Js::JavascriptOperators::OP_LdHandlerScope(pvVar6,pSVar7);
    SetEnv(this,pFStack_20);
  }
  _closureReg = (void *)0x0;
  RVar3 = FunctionBody::GetFuncExprScopeRegister(this_00);
  if ((RVar3 != 0xffffffff) && (*(long *)(this + 0x60) == 0)) {
    pSVar7 = GetScriptContext(this);
    _closureReg = Js::JavascriptOperators::OP_NewPseudoScope(pSVar7);
    SetReg<unsigned_int>(this,RVar3,_closureReg);
  }
  RVar3 = FunctionBody::GetLocalClosureRegister(this_00);
  if (RVar3 != 0xffffffff) {
    RVar4 = FunctionBody::GetConstantCount(this_00);
    if (RVar3 < RVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x619,"(closureReg >= executeFunction->GetConstantCount())",
                                  "closureReg >= executeFunction->GetConstantCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar2 = FunctionBody::HasScopeObject(this_00);
    if (bVar2) {
      NewScopeObject(this);
    }
    else {
      NewScopeSlots(this);
    }
    SetNonVarReg(this,RVar3,(Var)0x0);
  }
  RVar4 = FunctionBody::GetLocalFrameDisplayRegister(this_00);
  if (RVar4 != 0xffffffff) {
    RVar5 = FunctionBody::GetConstantCount(this_00);
    if (RVar4 < RVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x628,"(frameDisplayReg >= executeFunction->GetConstantCount())",
                                  "frameDisplayReg >= executeFunction->GetConstantCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (_closureReg != (void *)0x0) {
      pSVar7 = GetScriptContext(this);
      pFStack_20 = OP_LdFrameDisplay(this,_closureReg,pFStack_20,pSVar7);
    }
    if (RVar3 != 0xffffffff) {
      pvVar6 = GetLocalClosure(this);
      pFStack_20 = NewFrameDisplay(this,pvVar6,pFStack_20);
    }
    SetLocalFrameDisplay(this,pFStack_20);
    SetNonVarReg(this,RVar4,(Var)0x0);
  }
  this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xfe | 1);
  return;
}

Assistant:

void InterpreterStackFrame::InitializeClosures()
    {
        FunctionBody *executeFunction = this->function->GetFunctionBody();
        Var environment;

        if (executeFunction->IsParamAndBodyScopeMerged())
        {
            this->SetIsParamScopeDone(true);
        }

        RegSlot thisRegForEventHandler = executeFunction->GetThisRegisterForEventHandler();
        if (thisRegForEventHandler != Constants::NoRegister)
        {
            Var varThis = OP_ArgIn0();
            SetReg(thisRegForEventHandler, varThis);
            environment = JavascriptOperators::OP_LdHandlerScope(varThis, GetScriptContext());
            this->SetEnv((FrameDisplay*)environment);
        }
        else if (this->paramClosure != nullptr)
        {
            // When paramClosure is non-null we are calling this method to initialize the closure for body scope.
            // In this case we have to use the param scope's closure as the parent for the body scope's frame display.
            Assert(!executeFunction->IsParamAndBodyScopeMerged());
            environment = this->GetLocalFrameDisplay();
        }
        else
        {
            environment = this->LdEnv();
        }

        Var funcExprScope = nullptr;
        Js::RegSlot funcExprScopeReg = executeFunction->GetFuncExprScopeRegister();
        if (funcExprScopeReg != Constants::NoRegister && this->paramClosure == nullptr)
        {
            // t0 = NewPseudoScope
            // t1 = LdFrameDisplay t0 env

            funcExprScope = JavascriptOperators::OP_NewPseudoScope(GetScriptContext());
            SetReg(funcExprScopeReg, funcExprScope);
        }

        RegSlot closureReg = executeFunction->GetLocalClosureRegister();
        if (closureReg != Js::Constants::NoRegister)
        {
            Assert(closureReg >= executeFunction->GetConstantCount());
            if (executeFunction->HasScopeObject())
            {
                this->NewScopeObject();
            }
            else
            {
                this->NewScopeSlots();
            }
            this->SetNonVarReg(closureReg, nullptr);
        }

        Js::RegSlot frameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
        if (frameDisplayReg != Js::Constants::NoRegister)
        {
            Assert(frameDisplayReg >= executeFunction->GetConstantCount());

            if (funcExprScope != nullptr)
            {
                environment = OP_LdFrameDisplay(funcExprScope, environment, GetScriptContext());
            }

            if (closureReg != Js::Constants::NoRegister)
            {
                void *argHead = this->GetLocalClosure();
                environment = this->NewFrameDisplay(argHead, environment);
            }

            this->SetLocalFrameDisplay((Js::FrameDisplay*)environment);
            this->SetNonVarReg(frameDisplayReg, nullptr);
        }

        this->closureInitDone = true;
    }